

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDDD.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChNodeFEAxyzDDD::NodeIntStateGatherAcceleration
          (ChNodeFEAxyzDDD *this,uint off_a,ChStateDelta *a)

{
  double *pdVar1;
  double *pdVar2;
  long lVar3;
  Index index_3;
  Index index;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  lVar3 = (a->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3;
  if (lVar3 < (long)(ulong)off_a) goto LAB_00656792;
  pdVar2 = (a->super_ChVectorDynamic<double>).
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  pdVar1 = pdVar2 + off_a;
  uVar4 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar5 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar5 < 3) {
      uVar4 = (ulong)uVar5;
    }
    if (uVar5 != 0) goto LAB_0065661c;
  }
  else {
LAB_0065661c:
    uVar6 = 0;
    do {
      pdVar1[uVar6] =
           (this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.X0.m_data
           [uVar6 - 0xd];
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  if (uVar4 < 3) {
    do {
      pdVar1[uVar4] =
           (this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.X0.m_data
           [uVar4 - 0xd];
      uVar4 = uVar4 + 1;
    } while (uVar4 != 3);
  }
  if (lVar3 < (long)(ulong)(off_a + 3)) goto LAB_00656792;
  pdVar1 = pdVar2 + (off_a + 3);
  uVar4 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar5 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar5 < 3) {
      uVar4 = (ulong)uVar5;
    }
    if (uVar5 != 0) goto LAB_00656686;
  }
  else {
LAB_00656686:
    uVar6 = 0;
    do {
      pdVar1[uVar6] = (this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.D_dtdt.m_data[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  if (uVar4 < 3) {
    do {
      pdVar1[uVar4] = (this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.D_dtdt.m_data[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar4 != 3);
  }
  if (lVar3 < (long)(ulong)(off_a + 6)) goto LAB_00656792;
  pdVar1 = pdVar2 + (off_a + 6);
  uVar4 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar5 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar5 < 3) {
      uVar4 = (ulong)uVar5;
    }
    if (uVar5 != 0) goto LAB_006566f6;
  }
  else {
LAB_006566f6:
    uVar6 = 0;
    do {
      pdVar1[uVar6] = (this->super_ChNodeFEAxyzDD).DD_dtdt.m_data[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  if (uVar4 < 3) {
    do {
      pdVar1[uVar4] = (this->super_ChNodeFEAxyzDD).DD_dtdt.m_data[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar4 != 3);
  }
  if (lVar3 < (long)(ulong)(off_a + 9)) {
LAB_00656792:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  pdVar2 = pdVar2 + (off_a + 9);
  uVar4 = 3;
  if (((ulong)pdVar2 & 7) == 0) {
    uVar5 = -((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar5 < 3) {
      uVar4 = (ulong)uVar5;
    }
    if (uVar5 == 0) goto LAB_00656773;
  }
  uVar6 = 0;
  do {
    pdVar2[uVar6] = (this->DDD_dtdt).m_data[uVar6];
    uVar6 = uVar6 + 1;
  } while (uVar4 != uVar6);
LAB_00656773:
  if (uVar4 < 3) {
    do {
      pdVar2[uVar4] = (this->DDD_dtdt).m_data[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar4 != 3);
  }
  return;
}

Assistant:

void ChNodeFEAxyzDDD::NodeIntStateGatherAcceleration(const unsigned int off_a, ChStateDelta& a) {
    a.segment(off_a + 0, 3) = pos_dtdt.eigen();
    a.segment(off_a + 3, 3) = D_dtdt.eigen();
    a.segment(off_a + 6, 3) = DD_dtdt.eigen();
	a.segment(off_a + 9, 3) = DDD_dtdt.eigen();
}